

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  int *piVar8;
  uchar *puVar9;
  ulong uVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  size_t sVar24;
  uchar *puVar25;
  uint local_48;
  
  uVar2 = ssl->in_msglen;
  uVar13 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4;
  if (uVar2 < uVar13) {
    return -0x7200;
  }
  piVar3 = (int *)ssl->in_msg;
  lVar14 = (ulong)*(byte *)((long)piVar3 + 1) * 0x10000;
  lVar22 = (ulong)*(byte *)((long)piVar3 + 2) * 0x100;
  uVar18 = (ulong)*(byte *)((long)piVar3 + 3);
  uVar21 = (lVar22 + lVar14 | uVar18) + uVar13;
  ssl->in_hslen = uVar21;
  if ((ssl->conf->field_0x174 & 2) == 0) {
    if (uVar21 <= uVar2) {
      return 0;
    }
    return -0x7080;
  }
  pmVar4 = ssl->handshake;
  if (pmVar4 == (mbedtls_ssl_handshake_params *)0x0) {
LAB_00115021:
    if ((((uVar2 < uVar21) || ((char)piVar3[2] != '\0' || *(short *)((long)piVar3 + 6) != 0)) ||
        (uVar6 = *(ushort *)((long)piVar3 + 9) ^ *(ushort *)((long)piVar3 + 1), uVar7 = (uint)uVar6,
        *(char *)((long)piVar3 + 0xb) != *(char *)((long)piVar3 + 3) || uVar6 != 0)) ||
       ((pmVar4 != (mbedtls_ssl_handshake_params *)0x0 && (pmVar4->hs_msg != (uchar *)0x0)))) {
      uVar7 = 0xffff8f80;
      if (pmVar4 != (mbedtls_ssl_handshake_params *)0x0) {
        uVar2 = uVar21 - 0xc;
        if ((int *)pmVar4->hs_msg == (int *)0x0) {
          if ((uint)uVar21 < 0x4001) {
            piVar8 = (int *)calloc(1,((uVar2 >> 3) + uVar21 + 1) - (ulong)((uVar2 & 7) == 0));
            pmVar4->hs_msg = (uchar *)piVar8;
            if (piVar8 == (int *)0x0) {
              puVar9 = (uchar *)0xffff8100;
            }
            else {
              *(short *)(piVar8 + 1) = (short)piVar3[1];
              *piVar8 = *piVar3;
              puVar9 = pmVar4->hs_msg;
              puVar9[8] = '\0';
              puVar9[6] = '\0';
              puVar9[7] = '\0';
              puVar9 = ssl->handshake->hs_msg;
              puVar9[0xb] = puVar9[3];
              *(undefined2 *)(puVar9 + 9) = *(undefined2 *)(puVar9 + 1);
            }
            uVar7 = (uint)puVar9;
            bVar5 = piVar8 != (int *)0x0;
          }
          else {
            uVar7 = 0xffff8f80;
            bVar5 = false;
          }
          if (bVar5) goto LAB_0011517a;
        }
        else {
          uVar7 = 0xffff8e00;
          if (*(int *)pmVar4->hs_msg == *piVar3) {
LAB_0011517a:
            puVar9 = ssl->in_msg;
            bVar15 = puVar9[8];
            uVar19 = (ulong)((uint)puVar9[7] << 8 | (uint)puVar9[6] << 0x10) | (ulong)bVar15;
            uVar23 = (uint)puVar9[10] << 8 | (uint)puVar9[9] << 0x10;
            bVar16 = puVar9[0xb];
            sVar12 = (ulong)uVar23 + (ulong)bVar16;
            uVar7 = 0xffff8e00;
            if ((sVar12 + uVar19 <= uVar2) && (uVar1 = sVar12 + 0xc, uVar1 <= ssl->in_msglen)) {
              puVar25 = ssl->handshake->hs_msg;
              memcpy(puVar25 + uVar19 + 0xc,puVar9 + 0xc,sVar12);
              bVar15 = bVar15 & 7;
              if (bVar15 == 0) {
LAB_001152b3:
                if ((sVar12 & 7) != 0) {
                  uVar10 = uVar19 + sVar12 >> 3;
                  bVar15 = puVar25[uVar10 + uVar21];
                  iVar11 = 8 - ((uint)sVar12 & 7);
                  do {
                    bVar15 = bVar15 | (byte)(1 << ((byte)iVar11 & 0x1f));
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != 8);
                  puVar25[uVar10 + uVar21] = bVar15;
                }
                memset(puVar25 + (uVar19 >> 3) + uVar21,0xff,sVar12 >> 3);
              }
              else {
                bVar15 = 8 - bVar15;
                uVar10 = uVar19 >> 3;
                uVar20 = (uint)sVar12;
                uVar7 = (uint)bVar15;
                if (uVar20 < bVar15 || uVar20 == uVar7) {
                  if (sVar12 != 0) {
                    bVar17 = puVar25[uVar10 + uVar21];
                    local_48 = (uint)bVar16;
                    iVar11 = uVar7 - (uVar23 + local_48);
                    do {
                      bVar17 = bVar17 | (byte)(1 << ((byte)iVar11 & 0x1f));
                      iVar11 = iVar11 + 1;
                      sVar12 = sVar12 - 1;
                    } while (sVar12 != 0);
                    puVar25[uVar10 + uVar21] = bVar17;
                  }
                  sVar12 = 0;
                }
                else {
                  bVar16 = puVar25[uVar10 + uVar21];
                  do {
                    uVar7 = uVar7 - 1;
                    bVar16 = bVar16 | (byte)(1 << ((byte)uVar7 & 0x1f));
                  } while (uVar7 != 0);
                  uVar19 = uVar19 + bVar15;
                  sVar12 = sVar12 - bVar15;
                  puVar25[uVar10 + uVar21] = bVar16;
                }
                if (bVar15 < uVar20) goto LAB_001152b3;
              }
              if (7 < uVar2) {
                lVar22 = uVar13 + lVar14 + lVar22;
                uVar13 = 0;
                do {
                  if (puVar25[uVar13 + uVar18 + lVar22] != 0xff) goto LAB_0011542a;
                  uVar13 = uVar13 + 1;
                } while ((uVar18 - 0xc) + lVar22 >> 3 != uVar13);
              }
              if ((uVar2 & 7) != 0) {
                lVar14 = 0;
                do {
                  if ((puVar25[(uVar2 >> 3) + uVar21] >> ((int)lVar14 + 7U & 0x1f) & 1) == 0)
                  goto LAB_0011542a;
                  lVar14 = lVar14 + -1;
                } while (-lVar14 != (uVar2 & 7));
              }
              uVar7 = 0xffff8f80;
              if (ssl->in_msglen <= uVar1) {
                uVar13 = ssl->next_record_offset;
                sVar12 = ssl->in_left - uVar13;
                if (uVar13 <= ssl->in_left && sVar12 != 0) {
                  puVar9 = ssl->in_hdr;
                  sVar24 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar9;
                  ssl->next_record_offset = sVar24;
                  puVar25 = (uchar *)(sVar24 + sVar12);
                  ssl->in_left = (size_t)puVar25;
                  uVar7 = 0xffff9600;
                  if (ssl->in_buf + (0x414d - (long)puVar9) < puVar25) goto LAB_0011542f;
                  memmove(ssl->in_msg + ssl->in_hslen,puVar9 + uVar13,sVar12);
                }
                memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
                free(ssl->handshake->hs_msg);
                ssl->handshake->hs_msg = (uchar *)0x0;
                uVar7 = 0;
              }
            }
          }
        }
      }
LAB_0011542f:
      if (uVar7 != 0) goto LAB_00115433;
    }
    bVar5 = true;
  }
  else {
    uVar7 = (uint)(ushort)(*(ushort *)(piVar3 + 1) << 8 | *(ushort *)(piVar3 + 1) >> 8);
    if (ssl->state == 0x10) {
LAB_0011500c:
      if ((char)*piVar3 == '\x01') goto LAB_00115021;
    }
    else if (uVar7 == pmVar4->in_msg_seq) {
      if (ssl->state != 0x10) goto LAB_00115021;
      goto LAB_0011500c;
    }
    if (((uVar7 != pmVar4->in_flight_start_seq - 1) || ((char)*piVar3 == '\x03')) ||
       (uVar7 = mbedtls_ssl_resend(ssl), uVar7 == 0)) {
      uVar7 = 0xffff9a80;
    }
LAB_00115433:
    bVar5 = false;
  }
  if (bVar5) {
    return 0;
  }
  return uVar7;
LAB_0011542a:
  uVar7 = 0xffff9a80;
  goto LAB_0011542f;
}

Assistant:

int mbedtls_ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        if( ssl->handshake != NULL &&
            ( ( ssl->state   != MBEDTLS_SSL_HANDSHAKE_OVER &&
                recv_msg_seq != ssl->handshake->in_msg_seq ) ||
              ( ssl->state  == MBEDTLS_SSL_HANDSHAKE_OVER &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_CLIENT_HELLO ) ) )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_CONTINUE_PROCESSING );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    return( 0 );
}